

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::initialiseLpColCost(HEkk *this)

{
  ObjSense OVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  
  dVar7 = ldexp(1.0,(this->options_->super_HighsOptionsStruct).cost_scale_factor);
  lVar5 = (long)(this->lp_).num_col_;
  if (0 < lVar5) {
    OVar1 = (this->lp_).sense_;
    pdVar2 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      pdVar3[lVar6] = pdVar2[lVar6] * dVar7 * (double)OVar1;
      pdVar4[lVar6] = 0.0;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return;
}

Assistant:

void HEkk::initialiseLpColCost() {
  double cost_scale_factor = pow(2.0, options_->cost_scale_factor);
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    info_.workCost_[iCol] =
        (HighsInt)lp_.sense_ * cost_scale_factor * lp_.col_cost_[iCol];
    info_.workShift_[iCol] = 0;
  }
}